

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_rle.c
# Opt level: O0

exr_result_t
internal_exr_undo_rle
          (exr_decode_pipeline_t *decode,void *src,uint64_t packsz,void *out,uint64_t outsz)

{
  uint64_t packedbytes;
  void **in_RCX;
  uint64_t in_RDX;
  exr_decode_pipeline_t *in_RSI;
  uint64_t in_RDI;
  size_t *in_R8;
  uint64_t unpackb;
  exr_result_t rv;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar1;
  
  if ((in_RDX == 0) || (in_RSI == (exr_decode_pipeline_t *)0x0)) {
    *(undefined8 *)(in_RDI + 0x68) = 0;
    eVar1 = 0;
  }
  else {
    eVar1 = internal_decode_alloc_buffer
                      (in_RSI,(exr_transcoding_pipeline_buffer_id_t)(in_RDX >> 0x20),in_RCX,in_R8,
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (eVar1 == 0) {
      packedbytes = internal_rle_decompress
                              ((uint8_t *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                               (uint8_t *)in_RSI,in_RDX);
      if ((in_RDX == 0) || (packedbytes != 0)) {
        unpredict_and_reorder(in_RCX,*(void **)(in_RDI + 0xb8),packedbytes);
        *(uint64_t *)(in_RDI + 0x68) = packedbytes;
        eVar1 = 0;
      }
      else {
        eVar1 = 0x17;
      }
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
internal_exr_undo_rle (
    exr_decode_pipeline_t* decode,
    const void*            src,
    uint64_t               packsz,
    void*                  out,
    uint64_t               outsz)
{
    exr_result_t rv;
    uint64_t     unpackb;

    if (packsz == 0 || src == NULL)
    {
        decode->bytes_decompressed = 0;
        return EXR_ERR_SUCCESS;
    }

    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        outsz);
    if (rv != EXR_ERR_SUCCESS) return rv;

    unpackb =
        internal_rle_decompress (decode->scratch_buffer_1, outsz, src, packsz);
    if (packsz > 0 && unpackb == 0)
        return EXR_ERR_CORRUPT_CHUNK;

    unpredict_and_reorder (out, decode->scratch_buffer_1, unpackb);

    decode->bytes_decompressed = unpackb;

    return EXR_ERR_SUCCESS;
}